

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_nbput_notify(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,Integer g_b,
                      Integer *ecoords,void *bufn,Integer *nbhandle)

{
  long *plVar1;
  long *plVar2;
  uint uVar3;
  int i;
  long lVar4;
  ulong uVar5;
  Integer IVar6;
  void *__dest;
  ulong uVar7;
  gai_putn_hdl_t *pgVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  size_t __size;
  Integer ldn [7];
  
  ldn[1] = 0;
  ldn[4] = 0;
  ldn[5] = 0;
  ldn[6] = 0;
  ldn[2] = 0;
  ldn[3] = 0;
  ldn[0] = 1;
  if (putn_handles_initted == '\0') {
    memset(putn_handles,0,0xc80);
    putn_handles_initted = '\x01';
  }
  pgVar8 = putn_handles;
  for (lVar4 = 0; lVar4 != 100; lVar4 = lVar4 + 1) {
    if (pgVar8->orighdl == (Integer *)0x0) goto LAB_0017118a;
    pgVar8 = pgVar8 + 1;
  }
  pnga_error("Too many outstanding put/notify operations!",0);
  lVar4 = -1;
LAB_0017118a:
  putn_handles[lVar4].orighdl = nbhandle;
  if (g_a == g_b) {
    uVar5 = pnga_ndim(g_a);
    uVar10 = 0;
    uVar7 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar7 = uVar10;
    }
    do {
      if (uVar7 == uVar10) {
        uVar3 = GA[g_a + 1000].elemsize;
        __size = (size_t)(int)uVar3;
        IVar6 = pnga_ndim(g_a);
        lVar9 = *ecoords - *lo;
        for (lVar11 = 1; lVar11 < (int)IVar6; lVar11 = lVar11 + 1) {
          lVar9 = lVar9 + (ecoords[lVar11] - lo[lVar11]) * ld[lVar11 + -1];
        }
        if (lVar9 != ((long)bufn - (long)buf) / (long)__size) {
          pnga_error("Intersecting buffers, but notify element is not in buffer!",0);
        }
        __dest = malloc(__size);
        memcpy(__dest,bufn,__size);
        uVar7 = 0;
        uVar10 = 0;
        if (0 < (int)uVar3) {
          uVar10 = (ulong)uVar3;
        }
        for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
          *(char *)((long)bufn + uVar7) = *(char *)((long)bufn + uVar7) + '\x01';
        }
        putn_handles[lVar4].elem_copy = __dest;
        ngai_put_common(g_a,lo,hi,buf,ld,0,-1,&putn_handles[lVar4].firsthdl);
        ngai_put_common(g_a,ecoords,ecoords,__dest,ldn,0,-1,&putn_handles[lVar4].elementhdl);
        return;
      }
      plVar1 = ecoords + uVar10;
    } while ((lo[uVar10] <= *plVar1) &&
            (plVar2 = hi + uVar10, uVar10 = uVar10 + 1, *plVar1 <= *plVar2));
  }
  ngai_put_common(g_a,lo,hi,buf,ld,0,-1,&putn_handles[lVar4].firsthdl);
  ngai_put_common(g_b,ecoords,ecoords,bufn,ldn,0,-1,&putn_handles[lVar4].elementhdl);
  putn_handles[lVar4].elem_copy = (void *)0x0;
  return;
}

Assistant:

void pnga_nbput_notify(Integer g_a, Integer *lo, Integer *hi, void *buf, Integer *ld, Integer g_b, Integer *ecoords, void *bufn, Integer *nbhandle)
{
  Integer ldn[MAXDIM] = { 1 };
  int pos, intersect;

  /* Make sure everything has been initialized */
  if (!putn_handles_initted) {
    memset(putn_handles, 0, sizeof(putn_handles));
    putn_handles_initted = 1;
  }

  pos = putn_find_empty_slot();
  if (pos == -1) /* no empty handles available */
    pnga_error("Too many outstanding put/notify operations!", 0);

  putn_handles[pos].orighdl = nbhandle; /* Store original handle for nbwait_notify */

  if (g_a == g_b)
    intersect = putn_intersect_coords(g_a, lo, hi, ecoords);
  else
    intersect = 0;

  if (!intersect) { /* Simpler case */
    ngai_put_common(g_a, lo, hi, buf, ld, 0, -1, &putn_handles[pos].firsthdl);
    ngai_put_common(g_b, ecoords, ecoords, bufn, ldn, 0, -1, &putn_handles[pos].elementhdl);

    putn_handles[pos].elem_copy = NULL;
  }
  else {
    int ret, i;
    Integer handle = GA_OFFSET + g_a, size;
    void *elem_copy;
    char *elem;

    size = GA[handle].elemsize;
    ret = putn_verify_element_in_buf(g_a, lo, hi, buf, ld, ecoords, bufn, size);

    if (!ret)
      pnga_error("Intersecting buffers, but notify element is not in buffer!", 0);

    elem_copy = malloc(size);
    memcpy(elem_copy, bufn, size);

    elem = bufn;
    for (i = 0; i < size; i++)
      elem[i] += 1; /* Increment each byte by one, safe? */

    putn_handles[pos].elem_copy = elem_copy;

    ngai_put_common(g_a, lo, hi, buf, ld, 0, -1, &putn_handles[pos].firsthdl);
    ngai_put_common(g_a, ecoords, ecoords, elem_copy, ldn, 0, -1,
		    &putn_handles[pos].elementhdl);
  }
}